

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node48.cpp
# Opt level: O3

void duckdb::Node48::Free(ART *art,Node *node)

{
  ulong uVar1;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  type paVar3;
  iterator iVar4;
  pointer this;
  data_ptr_t pdVar5;
  idx_t i;
  long lVar6;
  long lVar7;
  ulong local_28;
  
  uVar1 = (node->super_IndexPointer).data;
  paVar3 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
           ::operator*(&art->allocators);
  _Var2._M_head_impl =
       paVar3->_M_elems[4].
       super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
       .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
  local_28 = uVar1 & 0xffffffff;
  iVar4 = ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&((_Var2._M_head_impl)->buffers)._M_h,&local_28);
  this = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>::
         operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                     *)((long)iVar4.
                              super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                              ._M_cur + 0x10));
  pdVar5 = FixedSizeBuffer::Get(this,true);
  lVar7 = (ulong)((uint)(uVar1 >> 0x20) & 0xffffff) * (_Var2._M_head_impl)->segment_size;
  if (pdVar5[(_Var2._M_head_impl)->bitmask_offset + lVar7] != '\0') {
    lVar7 = (_Var2._M_head_impl)->bitmask_offset + lVar7;
    lVar6 = 0;
    do {
      if ((ulong)pdVar5[lVar6 + lVar7 + 1] != 0x30) {
        Node::Free(art,(Node *)(pdVar5 + (ulong)pdVar5[lVar6 + lVar7 + 1] * 8 + lVar7 + 0x108));
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
  }
  return;
}

Assistant:

void Node48::Free(ART &art, Node &node) {
	auto &n48 = Node::Ref<Node48>(art, node, NODE_48);
	if (!n48.count) {
		return;
	}

	Iterator(n48, [&](Node &child) { Node::Free(art, child); });
}